

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theme.h
# Opt level: O3

shared_ptr<gui::PanelStyle> __thiscall
gui::Theme::getStyle<gui::PanelStyle>(Theme *this,String *widgetName)

{
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *pvVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<gui::Style> sVar3;
  undefined1 auVar4 [16];
  shared_ptr<gui::PanelStyle> sVar5;
  _func_int **local_20;
  Gui *local_18;
  
  sVar3 = getStyle((Theme *)&stack0xffffffffffffffe0,widgetName);
  _Var2 = sVar3.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_20 != (_func_int **)0x0) {
    auVar4 = __dynamic_cast(local_20,&Style::typeinfo,&PanelStyle::typeinfo,0);
    _Var2._M_pi = auVar4._8_8_;
    if (auVar4._0_8_ != (_func_int **)0x0) {
      this->_vptr_Theme = auVar4._0_8_;
      this->gui_ = local_18;
      if (local_18 != (Gui *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pvVar1 = &(local_18->super_ContainerBase).children_;
          *(int *)&(pvVar1->
                   super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar1->
                        super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
          UNLOCK();
        }
        else {
          pvVar1 = &(local_18->super_ContainerBase).children_;
          *(int *)&(pvVar1->
                   super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar1->
                        super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      goto LAB_00155b53;
    }
  }
  this->_vptr_Theme = (_func_int **)0x0;
  this->gui_ = (Gui *)0x0;
LAB_00155b53:
  if (local_18 != (Gui *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
    _Var2._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar5.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::PanelStyle>)
         sVar5.super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> getStyle(const sf::String& widgetName) const {
        return std::dynamic_pointer_cast<T>(getStyle(widgetName));
    }